

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_freq_substraction.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> local_398;
  _InputArray local_378;
  undefined1 local_360 [63];
  allocator local_321;
  string local_320 [32];
  Mat local_300 [352];
  _OutputArray local_1a0;
  _InputArray local_188;
  Mat local_170 [8];
  Mat gauss;
  undefined1 local_110 [32];
  undefined1 local_f0 [40];
  Mat image;
  pointer local_c0;
  undefined1 local_60 [8];
  arguments_t args;
  char **argv_local;
  int argc_local;
  
  args.parameters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  arguments_t::arguments_t((arguments_t *)local_60,argc,argv);
  sVar1 = arguments_t::parametersSize((arguments_t *)local_60);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)args.parameters.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2," <input> <output>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    arguments_t::operator[][abi_cxx11_((arguments_t *)local_f0,(int)local_60);
    cv::imread((string *)(local_f0 + 0x20),(int)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    if (local_c0 == (pointer)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot open ");
      arguments_t::operator[][abi_cxx11_((arguments_t *)local_110,(int)local_60);
      poVar2 = std::operator<<(poVar2,(string *)local_110);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_110);
    }
    else {
      cv::Mat::clone();
      cv::_InputArray::_InputArray(&local_188,(Mat *)(local_f0 + 0x20));
      cv::_OutputArray::_OutputArray(&local_1a0,local_170);
      cv::medianBlur(&local_188,&local_1a0,7);
      cv::_OutputArray::~_OutputArray(&local_1a0);
      cv::_InputArray::~_InputArray(&local_188);
      cv::operator-(local_300,(Mat *)(local_f0 + 0x20));
      cv::Mat::operator=((Mat *)(local_f0 + 0x20),(MatExpr *)local_300);
      cv::MatExpr::~MatExpr((MatExpr *)local_300);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"result",&local_321);
      cv::_InputArray::_InputArray((_InputArray *)(local_360 + 0x20),local_170);
      cv::imshow(local_320,(_InputArray *)(local_360 + 0x20));
      cv::_InputArray::~_InputArray((_InputArray *)(local_360 + 0x20));
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      cv::waitKey(0);
      arguments_t::operator[][abi_cxx11_((arguments_t *)local_360,(int)local_60);
      cv::_InputArray::_InputArray(&local_378,(Mat *)(local_f0 + 0x20));
      local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_398);
      cv::imwrite((string *)local_360,&local_378,(vector *)&local_398);
      std::vector<int,_std::allocator<int>_>::~vector(&local_398);
      cv::_InputArray::~_InputArray(&local_378);
      std::__cxx11::string::~string((string *)local_360);
      cv::Mat::~Mat(local_170);
    }
    cv::Mat::~Mat((Mat *)(local_f0 + 0x20));
  }
  arguments_t::~arguments_t((arguments_t *)local_60);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    arguments_t args(argc, argv);
    if (args.parametersSize() < 2) {
        std::cout << "usage: " << argv[0] << " <input> <output>" << std::endl;
        return 0;
    }

    cv::Mat image = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
    if (!image.data) {
        std::cout << "Cannot open " << args[0] << std::endl;
        return 0;
    }

    auto gauss = image.clone();
    cv::medianBlur(image, gauss, 7);
    image = image - gauss;
    //cv::equalizeHist(image, image);

    cv::imshow("result", gauss);
    cv::waitKey();

    cv::imwrite(args[1], image);
    return 0;
}